

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O0

JsValueRef
WScriptJsrt::LoadScriptFileHelper
          (JsValueRef callee,JsValueRef *arguments,unsigned_short argumentCount,bool isSourceModule)

{
  JsValueRef *callee_00;
  char *pcVar1;
  PAL_FILE *stream;
  LPCSTR pCVar2;
  char *pcVar3;
  char *local_100;
  int local_9c;
  undefined1 local_98 [8];
  AutoString scriptInjectType;
  undefined1 local_68 [8];
  AutoString fileName;
  LPCSTR fileContent;
  LPCWSTR errorMessage;
  JsValueRef pvStack_30;
  JsErrorCode errorCode;
  JsValueRef returnValue;
  HRESULT hr;
  bool isSourceModule_local;
  unsigned_short argumentCount_local;
  JsValueRef *arguments_local;
  JsValueRef callee_local;
  
  returnValue._0_4_ = -0x7fffbffb;
  pvStack_30 = (JsValueRef)0x0;
  fileContent = "";
  returnValue._5_1_ = isSourceModule;
  returnValue._6_2_ = argumentCount;
  _hr = arguments;
  arguments_local = (JsValueRef *)callee;
  if ((argumentCount < 2) || (4 < argumentCount)) {
    errorMessage._4_4_ = JsErrorInvalidArgument;
    fileContent = "Need more or fewer arguments for WScript.LoadScript";
    goto LAB_00114e53;
  }
  AutoString::AutoString((AutoString *)local_68,arguments[1]);
  errorMessage._4_4_ = AutoString::GetError((AutoString *)local_68);
  if (errorMessage._4_4_ == JsNoError) {
    AutoString::AutoString((AutoString *)local_98);
    if ((returnValue._6_2_ < 3) ||
       (errorMessage._4_4_ = AutoString::Initialize((AutoString *)local_98,_hr[2]),
       errorMessage._4_4_ == JsNoError)) {
      if (errorMessage._4_4_ == JsNoError) {
        pcVar1 = AutoString::operator*((AutoString *)local_68);
        returnValue._0_4_ =
             Helpers::LoadScriptFromFile
                       (pcVar1,(LPCSTR *)&fileName.errorCode,(UINT *)0x0,(string *)0x0,false);
        callee_00 = arguments_local;
        if ((HRESULT)returnValue < 0) {
          stream = PAL_get_stderr(0);
          pCVar2 = AutoString::GetString((AutoString *)local_68);
          PAL_fprintf(stream,"Couldn\'t load file \'%s\'\n",pCVar2);
          errorMessage._4_4_ = ChakraRTInterface::JsGetUndefinedValue(&stack0xffffffffffffffd0);
          if (errorMessage._4_4_ == JsNoError) {
            callee_local = pvStack_30;
            local_9c = 1;
          }
          else {
            returnValue._0_4_ = -0x7fffbffb;
            local_9c = 4;
          }
          goto LAB_00114e0e;
        }
        pcVar1 = AutoString::operator*((AutoString *)local_68);
        pcVar3 = AutoString::operator*((AutoString *)local_98);
        if (pcVar3 == (char *)0x0) {
          local_100 = "self";
        }
        else {
          local_100 = AutoString::operator*((AutoString *)local_98);
        }
        pvStack_30 = LoadScript(callee_00,pcVar1,(LPCSTR)fileName._24_8_,local_100,
                                (bool)(returnValue._5_1_ & 1),FinalizeFree,true);
      }
      local_9c = 0;
    }
    else {
      returnValue._0_4_ = -0x7fffbffb;
      local_9c = 4;
    }
LAB_00114e0e:
    AutoString::~AutoString((AutoString *)local_98);
  }
  else {
    returnValue._0_4_ = -0x7fffbffb;
    local_9c = 4;
  }
  AutoString::~AutoString((AutoString *)local_68);
  if ((local_9c != 0) && (local_9c == 1)) {
    return callee_local;
  }
LAB_00114e53:
  SetExceptionIf(errorMessage._4_4_,(LPCWSTR)fileContent);
  return pvStack_30;
}

Assistant:

JsValueRef WScriptJsrt::LoadScriptFileHelper(JsValueRef callee, JsValueRef *arguments, unsigned short argumentCount, bool isSourceModule)
{
    HRESULT hr = E_FAIL;
    JsValueRef returnValue = JS_INVALID_REFERENCE;
    JsErrorCode errorCode = JsNoError;
    LPCWSTR errorMessage = _u("");

    if (argumentCount < 2 || argumentCount > 4)
    {
        errorCode = JsErrorInvalidArgument;
        errorMessage = _u("Need more or fewer arguments for WScript.LoadScript");
    }
    else
    {
        LPCSTR fileContent;
        AutoString fileName(arguments[1]);
        IfJsrtErrorSetGo(fileName.GetError());

        AutoString scriptInjectType;
        if (argumentCount > 2)
        {
            IfJsrtErrorSetGo(scriptInjectType.Initialize(arguments[2]));
        }

        if (errorCode == JsNoError)
        {
            hr = Helpers::LoadScriptFromFile(*fileName, fileContent);
            if (FAILED(hr))
            {
                fprintf(stderr, "Couldn't load file '%s'\n", fileName.GetString());
                IfJsrtErrorSetGo(ChakraRTInterface::JsGetUndefinedValue(&returnValue));
                return returnValue;
            }

            returnValue = LoadScript(callee, *fileName, fileContent, *scriptInjectType ? *scriptInjectType : "self", isSourceModule, WScriptJsrt::FinalizeFree, true);
        }
    }

Error:

    SetExceptionIf(errorCode, errorMessage);
    return returnValue;
}